

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline.c
# Opt level: O1

int dmrC_inline_function(dmr_C *C,expression *expr,symbol *sym)

{
  byte *pbVar1;
  uint uVar2;
  symbol *psVar3;
  ptr_list *head;
  symbol_list *psVar4;
  symbol *psVar5;
  expression *peVar6;
  symbol *__dest;
  int iVar7;
  undefined1 local_90 [8];
  ptr_list_iter nameiter__;
  ptr_list_iter argiter__;
  symbol_list *local_50;
  symbol_list *fn_symbol_list;
  expression *local_40;
  ptr_list *local_38;
  symbol_list *arg_decl;
  
  psVar3 = (sym->field_14).field_2.ctype.base_type;
  head = (ptr_list *)(expr->field_5).field_2.string;
  fn_symbol_list = (symbol_list *)dmrC_alloc_statement(C,expr->pos,3);
  if ((psVar3->field_14).field_2.inline_stmt == (statement *)0x0) {
    iVar7 = 0;
    dmrC_sparse_error(C,psVar3->pos,"marked inline, but without a definition");
  }
  else {
    uVar2 = *(uint *)((long)&psVar3->field_14 + 0xc);
    iVar7 = 0;
    if ((uVar2 >> 0x15 & 1) == 0) {
      *(uint *)((long)&psVar3->field_14 + 0xc) = uVar2 | 0x200000;
      psVar4 = (psVar3->field_14).field_2.arguments;
      *(undefined1 *)expr = 0x13;
      (expr->field_5).statement = (statement *)fn_symbol_list;
      expr->ctype = (psVar3->field_14).field_2.ctype.base_type;
      local_40 = expr;
      local_50 = create_symbol_list(C,(sym->field_14).field_2.inline_symbol_list);
      local_38 = (ptr_list *)0x0;
      ptrlist_forward_iterator((ptr_list_iter *)local_90,(ptr_list *)psVar4);
      psVar5 = (symbol *)ptrlist_iter_next((ptr_list_iter *)local_90);
      ptrlist_forward_iterator((ptr_list_iter *)&nameiter__.__nr,head);
      peVar6 = (expression *)ptrlist_iter_next((ptr_list_iter *)&nameiter__.__nr);
      if (peVar6 != (expression *)0x0) {
        do {
          __dest = dmrC_alloc_symbol(C->S,peVar6->pos,3);
          (__dest->field_14).field_2.ctype.base_type = peVar6->ctype;
          if (psVar5 != (symbol *)0x0) {
            memcpy(__dest,psVar5,0xe8);
            __dest->replace = psVar5;
            psVar5->replace = __dest;
            ptrlist_add((ptr_list **)&local_50,__dest,&C->ptrlist_allocator);
          }
          (__dest->field_14).field_2.initializer = peVar6;
          ptrlist_add(&local_38,__dest,&C->ptrlist_allocator);
          psVar5 = (symbol *)ptrlist_iter_next((ptr_list_iter *)local_90);
          peVar6 = (expression *)ptrlist_iter_next((ptr_list_iter *)&nameiter__.__nr);
        } while (peVar6 != (expression *)0x0);
      }
      psVar4 = fn_symbol_list;
      dmrC_copy_statement(C,(psVar3->field_14).field_2.inline_stmt,(statement *)fn_symbol_list);
      if (local_38 != (ptr_list *)0x0) {
        psVar5 = (symbol *)dmrC_alloc_statement(C,local_40->pos,1);
        (((anon_union_64_12_0e8c74c2_for_statement_2 *)&(psVar5->endpos).field_0x4)->field_1).
        expression = (expression *)local_38;
        psVar4->list_[1] = psVar5;
      }
      psVar4->list_[0] = sym;
      unset_replace_list(C,local_50);
      dmrC_evaluate_statement(C,(statement *)psVar4);
      pbVar1 = (byte *)((long)&psVar3->field_14 + 0xe);
      *pbVar1 = *pbVar1 & 0xdf;
      iVar7 = 1;
    }
  }
  return iVar7;
}

Assistant:

int dmrC_inline_function(struct dmr_C *C, struct expression *expr, struct symbol *sym)
{
	struct symbol_list * fn_symbol_list;
	struct symbol *fn = sym->ctype.base_type;
	struct expression_list *arg_list = expr->args;
	struct statement *stmt = dmrC_alloc_statement(C, expr->pos, STMT_COMPOUND);
	struct symbol_list *name_list, *arg_decl;
	struct symbol *name;
	struct expression *arg;

	if (!fn->inline_stmt) {
		dmrC_sparse_error(C, fn->pos, "marked inline, but without a definition");
		return 0;
	}
	if (fn->expanding)
		return 0;

	fn->expanding = 1;

	name_list = fn->arguments;

	expr->type = EXPR_STATEMENT;
	expr->statement = stmt;
	expr->ctype = fn->ctype.base_type;

	fn_symbol_list = create_symbol_list(C, sym->inline_symbol_list);

	arg_decl = NULL;
	PREPARE_PTR_LIST(name_list, name);
	FOR_EACH_PTR(arg_list, arg) {
		struct symbol *a = dmrC_alloc_symbol(C->S, arg->pos, SYM_NODE);

		a->ctype.base_type = arg->ctype;
		if (name) {
			*a = *name;
			set_replace(name, a);
			dmrC_add_symbol(C, &fn_symbol_list, a);
		}
		a->initializer = arg;
		dmrC_add_symbol(C, &arg_decl, a);

		NEXT_PTR_LIST(name);
	} END_FOR_EACH_PTR(arg);
	FINISH_PTR_LIST(name);

	dmrC_copy_statement(C, fn->inline_stmt, stmt);

	if (arg_decl) {
		struct statement *decl = dmrC_alloc_statement(C, expr->pos, STMT_DECLARATION);
		decl->declaration = arg_decl;
		stmt->args = decl;
	}
	stmt->inline_fn = sym;

	unset_replace_list(C, fn_symbol_list);

	dmrC_evaluate_statement(C, stmt);

	fn->expanding = 0;
	return 1;
}